

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexBuffer.cpp
# Opt level: O0

void __thiscall IndexBuffer::IndexBuffer(IndexBuffer *this,uint *data,uint count)

{
  bool bVar1;
  uint count_local;
  uint *data_local;
  IndexBuffer *this_local;
  
  this->_count = count;
  ClearGlErrors();
  (*___glewGenBuffers)(1,this);
  bVar1 = GlLogCall("glGenBuffers(1, &_rendererId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/IndexBuffer.cpp"
                    ,7);
  if (!bVar1) {
    raise(5);
  }
  Bind(this);
  ClearGlErrors();
  (*___glewBufferData)(0x8893,(ulong)count << 2,data,0x88e4);
  bVar1 = GlLogCall("glBufferData(GL_ELEMENT_ARRAY_BUFFER, count * sizeof(unsigned int), data, GL_STATIC_DRAW)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/IndexBuffer.cpp"
                    ,9);
  if (!bVar1) {
    raise(5);
  }
  return;
}

Assistant:

IndexBuffer::IndexBuffer(const unsigned int *data, unsigned int count) : _count(count)
{
    GL_CALL(glGenBuffers(1, &_rendererId));
    Bind();
    GL_CALL(glBufferData(GL_ELEMENT_ARRAY_BUFFER, count * sizeof(unsigned int), data, GL_STATIC_DRAW));
}